

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_utf8.c
# Opt level: O2

int u8_offset(char *str,int charnum)

{
  int iVar1;
  char *string;
  
  iVar1 = (int)str;
  for (; (0 < charnum && (*str != '\0')); str = str + 1) {
    charnum = charnum + -1;
  }
  return (int)str - iVar1;
}

Assistant:

int u8_offset(const char *str, int charnum)
{
    const char *string = str;

    while (charnum > 0 && *string != '\0') {
        if (*string++ & 0x80) {
            if (!isutf(*string)) {
                ++string;
                if (!isutf(*string)) {
                    ++string;
                    if (!isutf(*string)) {
                        ++string;
                    }
                }
            }
        }
        --charnum;
    }

    return (int)(string - str);
}